

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O0

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uv_buf_t uVar3;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  char *local_670;
  int64_t eval_b_13;
  int64_t eval_a_13;
  char *local_650;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  char *local_600;
  int64_t eval_b_8;
  int64_t eval_a_8;
  char *local_5e0;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_550 [4];
  int r;
  uv_buf_t buf;
  uv_udp_send_t req4;
  uv_udp_send_t req3;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  sockaddr_in addr3;
  sockaddr_in addr2;
  sockaddr_in addr;
  
  can_recverr = 1;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)addr2.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x76,"0","==","uv_ip4_addr(\"127.0.0.1\", 9123, &addr)",0,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,(sockaddr_in *)addr3.sin_zero);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x77,"0","==","uv_ip4_addr(\"127.0.0.1\", 9124, &addr2)",0,"==",(long)iVar1);
    abort();
  }
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a5,(sockaddr_in *)&req1.bufsml[3].len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x78,"0","==","uv_ip4_addr(\"127.0.0.1\", 9125, &addr3)",0,"==",(long)iVar1);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x7b,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x7e,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_udp_init(puVar2,&client);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x81,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_bind(&client,(sockaddr *)addr3.sin_zero,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0x84,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
  if ((long)iVar1 == 0) {
    uVar3 = uv_buf_init("PING",4);
    eval_a_8 = (int64_t)uVar3.base;
    _auStack_550 = (char *)eval_a_8;
    local_5e0 = (char *)uVar3.len;
    buf.base = local_5e0;
    iVar1 = uv_udp_send((uv_udp_send_t *)&req2.bufsml[3].len,&client,(uv_buf_t *)auStack_550,1,
                        (sockaddr *)addr2.sin_zero,send_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
              ,0x92,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    uVar3 = uv_buf_init("PANG",4);
    eval_a_9 = (int64_t)uVar3.base;
    _auStack_550 = (char *)eval_a_9;
    local_600 = (char *)uVar3.len;
    buf.base = local_600;
    iVar1 = uv_udp_send((uv_udp_send_t *)&req3.bufsml[3].len,&client,(uv_buf_t *)auStack_550,1,
                        (sockaddr *)addr2.sin_zero,send_cb);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
              ,0x9c,"r","==","0",(long)iVar1,"==",0);
      abort();
    }
    if (can_recverr != 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_udp_init(puVar2,&client2);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,0xa0,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_udp_bind(&client2,(sockaddr *)&req1.bufsml[3].len,0x20);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,0xa5,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      iVar1 = uv_udp_recv_start(&client2,alloc_cb,recv_cb);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,0xa8,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      uVar3 = uv_buf_init("PING",4);
      eval_a_13 = (int64_t)uVar3.base;
      _auStack_550 = (char *)eval_a_13;
      local_650 = (char *)uVar3.len;
      buf.base = local_650;
      iVar1 = uv_udp_send((uv_udp_send_t *)&req4.bufsml[3].len,&client2,(uv_buf_t *)auStack_550,1,
                          (sockaddr *)addr2.sin_zero,send_cb_recverr);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,0xb3,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
      uVar3 = uv_buf_init("PANG",4);
      eval_a_14 = (int64_t)uVar3.base;
      _auStack_550 = (char *)eval_a_14;
      local_670 = (char *)uVar3.len;
      buf.base = local_670;
      iVar1 = uv_udp_send((uv_udp_send_t *)&buf.len,&client2,(uv_buf_t *)auStack_550,1,
                          (sockaddr *)addr2.sin_zero,send_cb_recverr);
      if ((long)iVar1 != 0) {
        fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,0xbd,"r","==","0",(long)iVar1,"==",0);
        abort();
      }
    }
    puVar2 = uv_default_loop();
    uv_run(puVar2,UV_RUN_DEFAULT);
    iVar1 = 2;
    if (can_recverr != 0) {
      iVar1 = 4;
    }
    if ((long)send_cb_called != (long)iVar1) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
              ,0xc2,"send_cb_called","==","(long)(can_recverr ? 4 : 2)",(long)send_cb_called,"==",
              (long)iVar1);
      abort();
    }
    if ((long)recv_cb_called != (long)alloc_cb_called) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
              ,0xc3,"recv_cb_called","==","alloc_cb_called",(long)recv_cb_called,"==",
              (long)alloc_cb_called);
      abort();
    }
    if ((long)timer_cb_called == 1) {
      iVar1 = 2;
      if (can_recverr != 0) {
        iVar1 = 3;
      }
      if ((long)close_cb_called == (long)iVar1) {
        puVar2 = uv_default_loop();
        close_loop(puVar2);
        puVar2 = uv_default_loop();
        iVar1 = uv_loop_close(puVar2);
        if (iVar1 == 0) {
          uv_library_shutdown();
          return 0;
        }
        fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
                ,199,"0 == uv_loop_close(uv_default_loop())");
        abort();
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
              ,0xc5,"close_cb_called","==","(long)(can_recverr ? 3 : 2)",(long)close_cb_called,"==",
              (long)iVar1);
      abort();
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
            ,0xc4,"timer_cb_called","==","1",(long)timer_cb_called,"==",1);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-udp-send-unreachable.c"
          ,0x87,"r","==","0",(long)iVar1,"==",0);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  struct sockaddr_in addr3;
  uv_udp_send_t req1, req2, req3, req4;
  uv_buf_t buf;
  int r;

#ifdef __linux__
  can_recverr = 1;
#endif

  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));
  ASSERT_EQ(0, uv_ip4_addr("127.0.0.1", TEST_PORT_3, &addr3));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT_EQ(r, 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT_EQ(r, 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT_EQ(r, 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT_EQ(r, 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT_EQ(r, 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT_EQ(r, 0);

  if (can_recverr) {
    r = uv_udp_init(uv_default_loop(), &client2);
    ASSERT_EQ(r, 0);

    r = uv_udp_bind(&client2,
                    (const struct sockaddr*) &addr3,
                    UV_UDP_LINUX_RECVERR);
    ASSERT_EQ(r, 0);

    r = uv_udp_recv_start(&client2, alloc_cb, recv_cb);
    ASSERT_EQ(r, 0);

    /* client sends "PING", then "PANG" */
    buf = uv_buf_init("PING", 4);

    r = uv_udp_send(&req3,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);

    buf = uv_buf_init("PANG", 4);

    r = uv_udp_send(&req4,
                    &client2,
                    &buf,
                    1,
                    (const struct sockaddr*) &addr,
                    send_cb_recverr);
    ASSERT_EQ(r, 0);
  }

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(send_cb_called, (long)(can_recverr ? 4 : 2));
  ASSERT_EQ(recv_cb_called, alloc_cb_called);
  ASSERT_EQ(timer_cb_called, 1);
  ASSERT_EQ(close_cb_called, (long)(can_recverr ? 3 : 2));

  MAKE_VALGRIND_HAPPY();
  return 0;
}